

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

void re2::PatchList::Patch(Inst *inst0,PatchList l,uint32 val)

{
  Inst *this;
  
  while (l.p != 0) {
    this = inst0 + (l.p >> 1);
    if ((l.p & 1) == 0) {
      l.p = this->out_opcode_ >> 4;
      this->out_opcode_ = this->out_opcode_ & 0xf | val << 4;
    }
    else {
      l.p = Prog::Inst::out1(this);
      (this->field_1).out1_ = val;
    }
  }
  return;
}

Assistant:

void PatchList::Patch(Prog::Inst *inst0, PatchList l, uint32 val) {
  while (l.p != 0) {
    Prog::Inst* ip = &inst0[l.p>>1];
    if (l.p&1) {
      l.p = ip->out1();
      ip->out1_ = val;
    } else {
      l.p = ip->out();
      ip->set_out(val);
    }
  }
}